

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::SubjectFactory::FX::FXBase::SetSettlementDate
          (FXBase *this,string *tenor_key,string *settlement_key,Date *date)

{
  FX *pFVar1;
  Date *key;
  string *key_00;
  bool bVar2;
  string local_78;
  string local_48;
  Date *local_28;
  Date *date_local;
  string *settlement_key_local;
  string *tenor_key_local;
  FXBase *this_local;
  
  local_28 = date;
  date_local = (Date *)settlement_key;
  settlement_key_local = tenor_key;
  tenor_key_local = (string *)this;
  bVar2 = SubjectBuilder::ContainsKey
                    (&(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
                     tenor_key);
  key_00 = settlement_key_local;
  if (!bVar2) {
    pFVar1 = this->outer_class_;
    Tenor::ToString_abi_cxx11_(&local_48,(Tenor *)Tenor::BROKEN_DATE);
    SubjectBuilder::SetComponent
              (&(pFVar1->super_MandatoryFieldsSubjectCreator).subject_builder_,key_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  key = date_local;
  pFVar1 = this->outer_class_;
  tools::Date::ToString_abi_cxx11_(&local_78,local_28);
  SubjectBuilder::SetComponent
            (&(pFVar1->super_MandatoryFieldsSubjectCreator).subject_builder_,(string *)key,&local_78
            );
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void SubjectFactory::FX::FXBase::SetSettlementDate(const std::string& tenor_key, const std::string& settlement_key, Date* date)
{
    if (!outer_class_.subject_builder_.ContainsKey(tenor_key))
    {
        outer_class_.subject_builder_.SetComponent(tenor_key, Tenor::BROKEN_DATE.ToString());
    }

    outer_class_.subject_builder_.SetComponent(settlement_key, date->ToString());
}